

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O3

void duckdb::StringVector::AddHandle(Vector *vector,BufferHandle *handle)

{
  VectorStringBuffer *pVVar1;
  element_type *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_30;
  shared_ptr<duckdb::VectorBuffer,_true> local_28;
  
  pVVar1 = GetStringBuffer(vector);
  make_buffer<duckdb::ManagedVectorBuffer,duckdb::BufferHandle>((duckdb *)&local_38,handle);
  local_28.internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_38;
  local_28.internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = p_Stack_30;
  local_38 = (element_type *)0x0;
  p_Stack_30 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ::std::
  vector<duckdb::shared_ptr<duckdb::VectorBuffer,true>,std::allocator<duckdb::shared_ptr<duckdb::VectorBuffer,true>>>
  ::emplace_back<duckdb::shared_ptr<duckdb::VectorBuffer,true>>
            ((vector<duckdb::shared_ptr<duckdb::VectorBuffer,true>,std::allocator<duckdb::shared_ptr<duckdb::VectorBuffer,true>>>
              *)&pVVar1->references,&local_28);
  if (local_28.internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (p_Stack_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_30);
  }
  return;
}

Assistant:

void StringVector::AddHandle(Vector &vector, BufferHandle handle) {
	auto &string_buffer = GetStringBuffer(vector);
	string_buffer.AddHeapReference(make_buffer<ManagedVectorBuffer>(std::move(handle)));
}